

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minify_tests.c
# Opt level: O0

void cjson_minify_should_remove_multiline_comments(void)

{
  char *__dest;
  long in_FS_OFFSET;
  char *minified;
  char to_minify [51];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&minified,"{/* this is\n a /* multi\n //line \n {comment \"\\\" */}",0x33);
  __dest = (char *)malloc(0x33);
  if (__dest == (char *)0x0) {
    UnityFail(" Expected Non-NULL",0x4d);
  }
  strcpy(__dest,(char *)&minified);
  cJSON_Minify(__dest);
  UnityAssertEqualString("{}",__dest,(char *)0x0,0x51);
  free(__dest);
  if (*(long *)(in_FS_OFFSET + 0x28) != stack0xfffffffffffffff0) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void cjson_minify_should_remove_multiline_comments(void)
{
    const char to_minify[] = "{/* this is\n a /* multi\n //line \n {comment \"\\\" */}";

    char* minified = (char*) malloc(sizeof(to_minify));
    TEST_ASSERT_NOT_NULL(minified);
    strcpy(minified, to_minify);

    cJSON_Minify(minified);
    TEST_ASSERT_EQUAL_STRING("{}", minified);

    free(minified);
}